

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::ScrollTo(Element *this,Vector2f offset,ScrollBehavior behavior)

{
  Context *this_00;
  Vector2<float> VVar1;
  Context *context;
  ScrollBehavior behavior_local;
  Element *this_local;
  Vector2f offset_local;
  
  this_local = (Element *)offset;
  if ((behavior == Instant) || (this_00 = GetContext(this), this_00 == (Context *)0x0)) {
    SetScrollLeft(this,this_local._0_4_);
    SetScrollTop(this,this_local._4_4_);
  }
  else {
    VVar1.x = (this->scroll_offset).x;
    VVar1.y = (this->scroll_offset).y;
    VVar1 = Vector2<float>::operator-((Vector2<float> *)&this_local,VVar1);
    Context::PerformSmoothscrollOnTarget(this_00,this,VVar1,behavior);
  }
  return;
}

Assistant:

void Element::ScrollTo(Vector2f offset, ScrollBehavior behavior)
{
	if (behavior != ScrollBehavior::Instant)
	{
		if (Context* context = GetContext())
		{
			context->PerformSmoothscrollOnTarget(this, offset - scroll_offset, behavior);
			return;
		}
	}

	SetScrollLeft(offset.x);
	SetScrollTop(offset.y);
}